

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20M303DLHC.cpp
# Opt level: O2

bool __thiscall RTIMUGD20M303DLHC::setAccelCTRL4(RTIMUGD20M303DLHC *this)

{
  uint uVar1;
  RTIMUSettings *this_00;
  bool bVar2;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_GD20M303DLHCAccelFsr;
  if ((ulong)uVar1 < 4) {
    this->m_accelScale = *(RTFLOAT *)(&DAT_0011fb80 + (ulong)uVar1 * 4);
    bVar2 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_accelSlaveAddr,'#',
                               (char)uVar1 << 4 | 0x80,"Failed to set LSM303DLHC CTRL4");
    return bVar2;
  }
  fprintf(_stderr,"Illegal LSM303DLHC accel FSR code %d\n");
  return false;
}

Assistant:

bool RTIMUGD20M303DLHC::setAccelCTRL4()
{
    unsigned char ctrl4;

    switch (m_settings->m_GD20M303DLHCAccelFsr) {
    case LSM303DLHC_ACCEL_FSR_2:
        m_accelScale = (RTFLOAT)0.001 / (RTFLOAT)16;
        break;

    case LSM303DLHC_ACCEL_FSR_4:
        m_accelScale = (RTFLOAT)0.002 / (RTFLOAT)16;
        break;

    case LSM303DLHC_ACCEL_FSR_8:
        m_accelScale = (RTFLOAT)0.004 / (RTFLOAT)16;
        break;

    case LSM303DLHC_ACCEL_FSR_16:
        m_accelScale = (RTFLOAT)0.012 / (RTFLOAT)16;
        break;

    default:
        HAL_ERROR1("Illegal LSM303DLHC accel FSR code %d\n", m_settings->m_GD20M303DLHCAccelFsr);
        return false;
    }

    ctrl4 = 0x80 + (m_settings->m_GD20M303DLHCAccelFsr << 4);

    return m_settings->HALWrite(m_accelSlaveAddr,  LSM303DLHC_CTRL4_A, ctrl4, "Failed to set LSM303DLHC CTRL4");
}